

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_threadprivate.cpp
# Opt level: O3

private_common * kmp_threadprivate_insert(int gtid,void *pc_addr,void *data_addr,size_t pc_size)

{
  size_t size;
  common_table *pcVar1;
  kmp_info_t *pkVar2;
  kmp_info_t **ppkVar3;
  private_common *ppVar4;
  void *pvVar5;
  long *plVar6;
  code *pcVar7;
  private_data *ppVar8;
  long lVar9;
  uint uVar10;
  long *plVar11;
  kmp_msg_t local_48;
  
  __kmp_acquire_ticket_lock(&__kmp_global_lock,gtid);
  ppVar4 = (private_common *)___kmp_allocate(0x28);
  ppVar4->gbl_addr = pc_addr;
  uVar10 = (uint)((ulong)pc_addr >> 3) & 0x1ff;
  plVar11 = (long *)((long)__kmp_threadprivate_d_table.data + (ulong)(uVar10 << 3));
  plVar6 = plVar11;
  do {
    plVar6 = (long *)*plVar6;
    if (plVar6 == (long *)0x0) {
      plVar6 = (long *)___kmp_allocate(0x50);
      plVar6[3] = (long)pc_addr;
      plVar6[9] = pc_size;
      ppVar8 = __kmp_init_common_data(data_addr,pc_size);
      plVar6[1] = (long)ppVar8;
      *plVar6 = *plVar11;
      *plVar11 = (long)plVar6;
      goto LAB_0013c704;
    }
  } while ((void *)plVar6[3] != pc_addr);
  if ((plVar6[1] == 0) && (plVar6[2] == 0)) {
    plVar6[9] = pc_size;
    if (*(int *)(plVar6 + 8) == 0) {
      if (plVar6[4] != 0) goto LAB_0013c86a;
      if (plVar6[5] == 0) goto LAB_0013c89b;
      pvVar5 = ___kmp_allocate(pc_size);
      plVar6[2] = (long)pvVar5;
      (*(code *)plVar6[5])(pvVar5,pc_addr);
    }
    else if (plVar6[4] == 0) {
      if (plVar6[5] == 0) {
LAB_0013c89b:
        ppVar8 = __kmp_init_common_data(data_addr,pc_size);
        plVar6[1] = (long)ppVar8;
      }
      else {
        pvVar5 = ___kmp_allocate(pc_size);
        plVar6[2] = (long)pvVar5;
        (*(code *)plVar6[5])(pvVar5,pc_addr,plVar6[7]);
      }
    }
    else {
LAB_0013c86a:
      plVar6[2] = 0;
    }
  }
LAB_0013c704:
  size = plVar6[9];
  ppVar4->cmn_size = size;
  if (__kmp_foreign_tp == 0) {
    if ((((gtid < 0) || (__kmp_root[(uint)gtid] == (kmp_root_t *)0x0)) ||
        (__kmp_threads[(uint)gtid] == (kmp_info_t *)0x0)) ||
       (__kmp_threads[(uint)gtid] != (__kmp_root[(uint)gtid]->r).r_uber_thread)) goto LAB_0013c751;
  }
  else if (gtid != 0) {
LAB_0013c751:
    pc_addr = ___kmp_allocate(size);
  }
  ppVar4->par_addr = pc_addr;
  __kmp_release_ticket_lock(&__kmp_global_lock,gtid);
  if ((ulong)plVar6[9] < pc_size) {
    __kmp_msg_format(&local_48,0x40085);
    __kmp_fatal();
  }
  pcVar1 = (__kmp_threads[gtid]->th).th_pri_common;
  ppVar4->next = pcVar1->data[uVar10];
  pcVar1->data[uVar10] = ppVar4;
  ppkVar3 = __kmp_threads;
  ppVar4->link = (__kmp_threads[gtid]->th).th_pri_head;
  (ppkVar3[gtid]->th).th_pri_head = ppVar4;
  if (__kmp_foreign_tp == 0) {
    if (((-1 < gtid) && (__kmp_root[gtid] != (kmp_root_t *)0x0)) &&
       ((pkVar2 = ppkVar3[gtid], pkVar2 != (kmp_info_t *)0x0 &&
        (pkVar2 == (__kmp_root[gtid]->r).r_uber_thread)))) {
      return ppVar4;
    }
  }
  else if (gtid == 0) {
    return ppVar4;
  }
  pcVar7 = (code *)plVar6[4];
  if ((int)plVar6[8] == 0) {
    if (pcVar7 != (code *)0x0) {
      (*pcVar7)(ppVar4->par_addr);
      return ppVar4;
    }
    pcVar7 = (code *)plVar6[5];
    pvVar5 = ppVar4->par_addr;
    if (pcVar7 == (code *)0x0) goto LAB_0013c844;
    lVar9 = plVar6[2];
  }
  else {
    if (pcVar7 == (code *)0x0) {
      pvVar5 = ppVar4->par_addr;
      if ((code *)plVar6[5] != (code *)0x0) {
        (*(code *)plVar6[5])(pvVar5,plVar6[2],plVar6[7]);
        return ppVar4;
      }
LAB_0013c844:
      if (pvVar5 == ppVar4->gbl_addr) {
        return ppVar4;
      }
      __kmp_copy_common_data(pvVar5,(private_data *)plVar6[1]);
      return ppVar4;
    }
    pvVar5 = ppVar4->par_addr;
    lVar9 = plVar6[7];
  }
  (*pcVar7)(pvVar5,lVar9);
  return ppVar4;
}

Assistant:

struct private_common *kmp_threadprivate_insert(int gtid, void *pc_addr,
                                                void *data_addr,
                                                size_t pc_size) {
  struct private_common *tn, **tt;
  struct shared_common *d_tn;

  /* +++++++++ START OF CRITICAL SECTION +++++++++ */
  __kmp_acquire_lock(&__kmp_global_lock, gtid);

  tn = (struct private_common *)__kmp_allocate(sizeof(struct private_common));

  tn->gbl_addr = pc_addr;

  d_tn = __kmp_find_shared_task_common(
      &__kmp_threadprivate_d_table, gtid,
      pc_addr); /* Only the MASTER data table exists. */

  if (d_tn != 0) {
    /* This threadprivate variable has already been seen. */

    if (d_tn->pod_init == 0 && d_tn->obj_init == 0) {
      d_tn->cmn_size = pc_size;

      if (d_tn->is_vec) {
        if (d_tn->ct.ctorv != 0) {
          /* Construct from scratch so no prototype exists */
          d_tn->obj_init = 0;
        } else if (d_tn->cct.cctorv != 0) {
          /* Now data initialize the prototype since it was previously
           * registered */
          d_tn->obj_init = (void *)__kmp_allocate(d_tn->cmn_size);
          (void)(*d_tn->cct.cctorv)(d_tn->obj_init, pc_addr, d_tn->vec_len);
        } else {
          d_tn->pod_init = __kmp_init_common_data(data_addr, d_tn->cmn_size);
        }
      } else {
        if (d_tn->ct.ctor != 0) {
          /* Construct from scratch so no prototype exists */
          d_tn->obj_init = 0;
        } else if (d_tn->cct.cctor != 0) {
          /* Now data initialize the prototype since it was previously
             registered */
          d_tn->obj_init = (void *)__kmp_allocate(d_tn->cmn_size);
          (void)(*d_tn->cct.cctor)(d_tn->obj_init, pc_addr);
        } else {
          d_tn->pod_init = __kmp_init_common_data(data_addr, d_tn->cmn_size);
        }
      }
    }
  } else {
    struct shared_common **lnk_tn;

    d_tn = (struct shared_common *)__kmp_allocate(sizeof(struct shared_common));
    d_tn->gbl_addr = pc_addr;
    d_tn->cmn_size = pc_size;
    d_tn->pod_init = __kmp_init_common_data(data_addr, pc_size);
    /*
            d_tn->obj_init = 0;  // AC: commented out because __kmp_allocate
       zeroes the memory
            d_tn->ct.ctor = 0;
            d_tn->cct.cctor = 0;
            d_tn->dt.dtor = 0;
            d_tn->is_vec = FALSE;
            d_tn->vec_len = 0L;
    */
    lnk_tn = &(__kmp_threadprivate_d_table.data[KMP_HASH(pc_addr)]);

    d_tn->next = *lnk_tn;
    *lnk_tn = d_tn;
  }

  tn->cmn_size = d_tn->cmn_size;

  if ((__kmp_foreign_tp) ? (KMP_INITIAL_GTID(gtid)) : (KMP_UBER_GTID(gtid))) {
    tn->par_addr = (void *)pc_addr;
  } else {
    tn->par_addr = (void *)__kmp_allocate(tn->cmn_size);
  }

  __kmp_release_lock(&__kmp_global_lock, gtid);
/* +++++++++ END OF CRITICAL SECTION +++++++++ */

#ifdef USE_CHECKS_COMMON
  if (pc_size > d_tn->cmn_size) {
    KC_TRACE(
        10, ("__kmp_threadprivate_insert: THREADPRIVATE: %p (%" KMP_UINTPTR_SPEC
             " ,%" KMP_UINTPTR_SPEC ")\n",
             pc_addr, pc_size, d_tn->cmn_size));
    KMP_FATAL(TPCommonBlocksInconsist);
  }
#endif /* USE_CHECKS_COMMON */

  tt = &(__kmp_threads[gtid]->th.th_pri_common->data[KMP_HASH(pc_addr)]);

#ifdef KMP_TASK_COMMON_DEBUG
  if (*tt != 0) {
    KC_TRACE(
        10,
        ("__kmp_threadprivate_insert: WARNING! thread#%d: collision on %p\n",
         gtid, pc_addr));
  }
#endif
  tn->next = *tt;
  *tt = tn;

#ifdef KMP_TASK_COMMON_DEBUG
  KC_TRACE(10,
           ("__kmp_threadprivate_insert: thread#%d, inserted node %p on list\n",
            gtid, pc_addr));
  dump_list();
#endif

  /* Link the node into a simple list */

  tn->link = __kmp_threads[gtid]->th.th_pri_head;
  __kmp_threads[gtid]->th.th_pri_head = tn;

  if ((__kmp_foreign_tp) ? (KMP_INITIAL_GTID(gtid)) : (KMP_UBER_GTID(gtid)))
    return tn;

  /* if C++ object with copy constructor, use it;
   * else if C++ object with constructor, use it for the non-master copies only;
   * else use pod_init and memcpy
   *
   * C++ constructors need to be called once for each non-master thread on
   * allocate
   * C++ copy constructors need to be called once for each thread on allocate */

  /* C++ object with constructors/destructors; don't call constructors for
     master thread though */
  if (d_tn->is_vec) {
    if (d_tn->ct.ctorv != 0) {
      (void)(*d_tn->ct.ctorv)(tn->par_addr, d_tn->vec_len);
    } else if (d_tn->cct.cctorv != 0) {
      (void)(*d_tn->cct.cctorv)(tn->par_addr, d_tn->obj_init, d_tn->vec_len);
    } else if (tn->par_addr != tn->gbl_addr) {
      __kmp_copy_common_data(tn->par_addr, d_tn->pod_init);
    }
  } else {
    if (d_tn->ct.ctor != 0) {
      (void)(*d_tn->ct.ctor)(tn->par_addr);
    } else if (d_tn->cct.cctor != 0) {
      (void)(*d_tn->cct.cctor)(tn->par_addr, d_tn->obj_init);
    } else if (tn->par_addr != tn->gbl_addr) {
      __kmp_copy_common_data(tn->par_addr, d_tn->pod_init);
    }
  }
  /* !BUILD_OPENMP_C
      if (tn->par_addr != tn->gbl_addr)
          __kmp_copy_common_data( tn->par_addr, d_tn->pod_init ); */

  return tn;
}